

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_roxl_16_aw(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint value;
  
  uVar2 = m68ki_read_imm_16();
  uVar3 = m68ki_read_16_fc((int)(short)uVar2,m68ki_address_space | m68ki_cpu.s_flag);
  uVar4 = (m68ki_cpu.x_flag & 0x100) << 8 | uVar3;
  uVar1 = uVar4 * 2;
  uVar4 = uVar4 >> 0x10;
  value = uVar4 | uVar1 & 0xffff;
  m68ki_cpu.x_flag = (uVar4 | uVar1) >> 8;
  m68ki_cpu.c_flag = m68ki_cpu.x_flag;
  m68ki_write_16_fc((int)(short)uVar2,m68ki_cpu.s_flag | 1,value);
  m68ki_cpu.n_flag = value >> 8;
  m68ki_cpu.not_z_flag = value;
  m68ki_cpu.v_flag = 0;
  return;
}

Assistant:

static void m68k_op_roxl_16_aw(void)
{
	uint ea = EA_AW_16();
	uint src = m68ki_read_16(ea);
	uint res = ROL_17(src | (XFLAG_AS_1() << 16), 1);

	FLAG_C = FLAG_X = res >> 8;
	res = MASK_OUT_ABOVE_16(res);

	m68ki_write_16(ea, res);

	FLAG_N = NFLAG_16(res);
	FLAG_Z = res;
	FLAG_V = VFLAG_CLEAR;
}